

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

UBool __thiscall
icu_63::RuleBasedTimeZone::findNext
          (RuleBasedTimeZone *this,UDate base,UBool inclusive,UDate *transitionTime,
          TimeZoneRule **fromRule,TimeZoneRule **toRule)

{
  UDate UVar1;
  TimeZoneRule *pTVar2;
  char cVar3;
  UBool UVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int32_t iVar8;
  int32_t iVar9;
  Transition *prev;
  UBool avail1;
  Transition *pTStack_98;
  UBool avail0;
  UDate start1;
  UDate start0;
  TimeZoneRule *r1;
  TimeZoneRule *r0;
  double dStack_70;
  int32_t idx;
  UDate tt;
  Transition *tzt;
  Transition result;
  UBool found;
  UBool isFinal;
  TimeZoneRule **toRule_local;
  TimeZoneRule **fromRule_local;
  UDate *transitionTime_local;
  UBool inclusive_local;
  UDate base_local;
  RuleBasedTimeZone *this_local;
  
  if (this->fHistoricTransitions == (UVector *)0x0) {
    return '\0';
  }
  result.to._7_1_ = '\0';
  result.to._6_1_ = '\0';
  tt = (UDate)UVector::elementAt(this->fHistoricTransitions,0);
  dStack_70 = *(double *)tt;
  if (base < dStack_70) {
LAB_0022b7dc:
    tzt = *(Transition **)tt;
    result.time = *(double *)((long)tt + 8);
    result.from = *(TimeZoneRule **)((long)tt + 0x10);
    result.to._6_1_ = '\x01';
  }
  else {
    if (inclusive != '\0') {
      if ((dStack_70 == base) && (!NAN(dStack_70) && !NAN(base))) goto LAB_0022b7dc;
    }
    iVar8 = UVector::size(this->fHistoricTransitions);
    r0._4_4_ = iVar8 + -1;
    tt = (UDate)UVector::elementAt(this->fHistoricTransitions,r0._4_4_);
    dStack_70 = *(double *)tt;
    if (((inclusive == '\0') || (dStack_70 != base)) || (NAN(dStack_70) || NAN(base))) {
      if (base < dStack_70) {
        do {
          do {
            UVar1 = tt;
            r0._4_4_ = r0._4_4_ + -1;
            if (r0._4_4_ < 1) goto LAB_0022ba89;
            tt = (UDate)UVector::elementAt(this->fHistoricTransitions,r0._4_4_);
            dStack_70 = *(double *)tt;
            if (dStack_70 < base) goto LAB_0022ba89;
          } while (inclusive != '\0');
        } while ((dStack_70 != base) || (NAN(dStack_70) || NAN(base)));
LAB_0022ba89:
        tzt = *(Transition **)UVar1;
        result.time = *(UDate *)((long)UVar1 + 8);
        result.from = *(TimeZoneRule **)((long)UVar1 + 0x10);
        result.to._6_1_ = '\x01';
      }
      else if (this->fFinalRules != (UVector *)0x0) {
        r1 = (TimeZoneRule *)UVector::elementAt(this->fFinalRules,0);
        start0 = (UDate)UVector::elementAt(this->fFinalRules,1);
        pTVar2 = r1;
        uVar5 = TimeZoneRule::getRawOffset((TimeZoneRule *)start0);
        uVar6 = TimeZoneRule::getDSTSavings((TimeZoneRule *)start0);
        iVar7 = (*(pTVar2->super_UObject)._vptr_UObject[9])
                          (base,pTVar2,(ulong)uVar5,(ulong)uVar6,(ulong)(uint)(int)inclusive,&start1
                          );
        UVar1 = start0;
        iVar8 = TimeZoneRule::getRawOffset(r1);
        iVar9 = TimeZoneRule::getDSTSavings(r1);
        cVar3 = (**(code **)(*(long *)UVar1 + 0x48))
                          (base,UVar1,iVar8,iVar9,(int)inclusive,&stack0xffffffffffffff68);
        if (((char)iVar7 == '\0') && (cVar3 == '\0')) {
          return '\0';
        }
        if ((cVar3 == '\0') || (start1 < (double)pTStack_98)) {
          tzt = (Transition *)start1;
          result.time = start0;
          result.from = r1;
        }
        else {
          tzt = pTStack_98;
          result.time = (UDate)r1;
          result.from = (TimeZoneRule *)start0;
        }
        result.to._7_1_ = '\x01';
        result.to._6_1_ = '\x01';
      }
    }
    else {
      tzt = *(Transition **)tt;
      result.time = *(double *)((long)tt + 8);
      result.from = *(TimeZoneRule **)((long)tt + 0x10);
      result.to._6_1_ = '\x01';
    }
  }
  if (result.to._6_1_ == '\0') {
    this_local._7_1_ = '\0';
  }
  else {
    iVar8 = TimeZoneRule::getRawOffset((TimeZoneRule *)result.time);
    iVar9 = TimeZoneRule::getRawOffset(result.from);
    if (iVar8 == iVar9) {
      iVar8 = TimeZoneRule::getDSTSavings((TimeZoneRule *)result.time);
      iVar9 = TimeZoneRule::getDSTSavings(result.from);
      if (iVar8 == iVar9) {
        if (result.to._7_1_ != '\0') {
          return '\0';
        }
        UVar4 = findNext(this,(UDate)tzt,'\0',transitionTime,fromRule,toRule);
        return UVar4;
      }
    }
    *transitionTime = (UDate)tzt;
    *fromRule = (TimeZoneRule *)result.time;
    *toRule = result.from;
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool
RuleBasedTimeZone::findNext(UDate base, UBool inclusive, UDate& transitionTime,
                            TimeZoneRule*& fromRule, TimeZoneRule*& toRule) const {
    if (fHistoricTransitions == NULL) {
        return FALSE;
    }
    UBool isFinal = FALSE;
    UBool found = FALSE;
    Transition result;
    Transition *tzt = (Transition*)fHistoricTransitions->elementAt(0);
    UDate tt = tzt->time;
    if (tt > base || (inclusive && tt == base)) {
        result = *tzt;
        found = TRUE;
    } else {
        int32_t idx = fHistoricTransitions->size() - 1;        
        tzt = (Transition*)fHistoricTransitions->elementAt(idx);
        tt = tzt->time;
        if (inclusive && tt == base) {
            result = *tzt;
            found = TRUE;
        } else if (tt <= base) {
            if (fFinalRules != NULL) {
                // Find a transion time with finalRules
                TimeZoneRule *r0 = (TimeZoneRule*)fFinalRules->elementAt(0);
                TimeZoneRule *r1 = (TimeZoneRule*)fFinalRules->elementAt(1);
                UDate start0, start1;
                UBool avail0 = r0->getNextStart(base, r1->getRawOffset(), r1->getDSTSavings(), inclusive, start0);
                UBool avail1 = r1->getNextStart(base, r0->getRawOffset(), r0->getDSTSavings(), inclusive, start1);
                //  avail0/avail1 should be always TRUE
                if (!avail0 && !avail1) {
                    return FALSE;
                }
                if (!avail1 || start0 < start1) {
                    result.time = start0;
                    result.from = r1;
                    result.to = r0;
                } else {
                    result.time = start1;
                    result.from = r0;
                    result.to = r1;
                }
                isFinal = TRUE;
                found = TRUE;
            }
        } else {
            // Find a transition within the historic transitions
            idx--;
            Transition *prev = tzt;
            while (idx > 0) {
                tzt = (Transition*)fHistoricTransitions->elementAt(idx);
                tt = tzt->time;
                if (tt < base || (!inclusive && tt == base)) {
                    break;
                }
                idx--;
                prev = tzt;
            }
            result.time = prev->time;
            result.from = prev->from;
            result.to = prev->to;
            found = TRUE;
        }
    }
    if (found) {
        // For now, this implementation ignore transitions with only zone name changes.
        if (result.from->getRawOffset() == result.to->getRawOffset()
            && result.from->getDSTSavings() == result.to->getDSTSavings()) {
            if (isFinal) {
                return FALSE;
            } else {
                // No offset changes.  Try next one if not final
                return findNext(result.time, FALSE /* always exclusive */,
                    transitionTime, fromRule, toRule);
            }
        }
        transitionTime = result.time;
        fromRule = result.from;
        toRule = result.to;
        return TRUE;
    }
    return FALSE;
}